

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlxExtensions.cpp
# Opt level: O3

int Load_SGIX_pbuffer(void)

{
  uint uVar1;
  bool bVar2;
  bool bVar3;
  
  sf_ptrc_glXCreateGLXPbufferSGIX =
       (_func_GLXPbufferSGIX_Display_ptr_GLXFBConfigSGIX_uint_uint_int_ptr *)
       sf::Context::getFunction("glXCreateGLXPbufferSGIX");
  bVar2 = sf_ptrc_glXCreateGLXPbufferSGIX ==
          (_func_GLXPbufferSGIX_Display_ptr_GLXFBConfigSGIX_uint_uint_int_ptr *)0x0;
  sf_ptrc_glXDestroyGLXPbufferSGIX =
       (_func_void_Display_ptr_GLXPbufferSGIX *)sf::Context::getFunction("glXDestroyGLXPbufferSGIX")
  ;
  uVar1 = bVar2 + 1;
  if (sf_ptrc_glXDestroyGLXPbufferSGIX != (_func_void_Display_ptr_GLXPbufferSGIX *)0x0) {
    uVar1 = (uint)bVar2;
  }
  sf_ptrc_glXGetSelectedEventSGIX =
       (_func_void_Display_ptr_GLXDrawable_unsigned_long_ptr *)
       sf::Context::getFunction("glXGetSelectedEventSGIX");
  bVar2 = sf_ptrc_glXGetSelectedEventSGIX ==
          (_func_void_Display_ptr_GLXDrawable_unsigned_long_ptr *)0x0;
  sf_ptrc_glXQueryGLXPbufferSGIX =
       (_func_int_Display_ptr_GLXPbufferSGIX_int_uint_ptr *)
       sf::Context::getFunction("glXQueryGLXPbufferSGIX");
  bVar3 = sf_ptrc_glXQueryGLXPbufferSGIX == (_func_int_Display_ptr_GLXPbufferSGIX_int_uint_ptr *)0x0
  ;
  sf_ptrc_glXSelectEventSGIX =
       (_func_void_Display_ptr_GLXDrawable_unsigned_long *)
       sf::Context::getFunction("glXSelectEventSGIX");
  return (uint)bVar3 + uVar1 + bVar2 +
         (uint)(sf_ptrc_glXSelectEventSGIX ==
               (_func_void_Display_ptr_GLXDrawable_unsigned_long *)0x0);
}

Assistant:

static sf::GlFunctionPointer IntGetProcAddress(const char* name)
{
    return sf::Context::getFunction(name);
}